

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*> * __thiscall
TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*>::operator=
          (TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*> *this,
          TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*> *other)

{
  if (other != this) {
    if (this->Array != (PClassPlayerPawn **)0x0) {
      M_Free(this->Array);
    }
    DoCopy(this,other);
  }
  return this;
}

Assistant:

TArray<T,TT> &operator= (const TArray<T,TT> &other)
	{
		if (&other != this)
		{
			if (Array != NULL)
			{
				if (Count > 0)
				{
					DoDelete (0, Count-1);
				}
				M_Free (Array);
			}
			DoCopy (other);
		}
		return *this;
	}